

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O0

void __thiscall JetHead::list<Event_*>::push_back(list<Event_*> *this,Event **val)

{
  Node *pNVar1;
  Node *newTail;
  Event **val_local;
  list<Event_*> *this_local;
  
  pNVar1 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar1->val = *val;
  pNVar1->prev = this->mTail->prev;
  pNVar1->next = this->mTail;
  this->mTail->prev->next = pNVar1;
  this->mTail->prev = pNVar1;
  return;
}

Assistant:

void push_back(const T& val)
		{
			Node* newTail = jh_new Node;
			newTail->val = val;
			newTail->prev = mTail->prev;
			newTail->next = mTail;

			mTail->prev->next = newTail;
			mTail->prev = newTail;
		}